

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physics.c
# Opt level: O1

QuadTreeNode * RunPhysics(Level *lvl,double *pos,double *vec,double TimeToGo,Animation *PAnim)

{
  double *pdVar1;
  long lVar2;
  bool bVar3;
  QuadTreeNode *pQVar4;
  QuadTreeNode *pQVar5;
  QuadTreeNode *pQVar6;
  QuadTreeNode *pQVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  
  pQVar5 = GetCollisionNode(lvl,pos,vec);
  dVar8 = vec[1];
  vec[1] = dVar8 + 0.10000000149011612;
  *vec = *vec * 0.996999979019165;
  vec[1] = (dVar8 + 0.10000000149011612) * 0.996999979019165;
  pQVar7 = (QuadTreeNode *)&pQVar5->Contents;
  do {
    pQVar7 = (QuadTreeNode *)(pQVar7->Bounder).TL.Pos[0];
    if (pQVar7 == (QuadTreeNode *)0x0) break;
  } while (*(int *)((pQVar7->Bounder).TL.Pos + 1) != 2);
  do {
    if (pQVar7 == (QuadTreeNode *)0x0) {
      bVar3 = true;
    }
    else {
      dVar8 = *pos;
      dVar11 = pos[1];
      bVar3 = false;
      pQVar6 = pQVar7;
      do {
        pdVar1 = (double *)(pQVar6->Bounder).BR.Pos[0];
        dVar13 = pdVar1[6] * dVar8 + pdVar1[7] * dVar11 + pdVar1[8];
        if (((((-0.5 <= dVar13) && (dVar13 <= 0.05000000074505806)) && (*pdVar1 <= dVar8)) &&
            ((dVar8 <= pdVar1[2] && (pdVar1[1] <= dVar11)))) && (dVar11 <= pdVar1[3])) {
          dVar8 = dVar8 + pdVar1[6] * (0.05000000074505806 - dVar13);
          *pos = dVar8;
          dVar11 = dVar11 + (0.05000000074505806 - dVar13) *
                            *(double *)((long)(pQVar6->Bounder).BR.Pos[0] + 0x38);
          pos[1] = dVar11;
          bVar3 = true;
        }
        pQVar6 = (QuadTreeNode *)(pQVar6->Bounder).TL.Pos[0];
      } while (pQVar6 != (QuadTreeNode *)0x0);
      bVar3 = !bVar3;
    }
    dVar9 = TimeToGo * *vec;
    dVar10 = TimeToGo * vec[1];
    dVar11 = *pos;
    dVar13 = pos[1];
    dVar12 = dVar9 + dVar11;
    dVar8 = (pQVar5->Bounder).BR.Pos[0];
    if ((dVar12 <= dVar8) || (dVar8 = (dVar12 - dVar8) / dVar9, pQVar6 = pQVar5, 1.0 <= dVar8)) {
      dVar8 = 1.0;
      pQVar6 = (QuadTreeNode *)0x0;
    }
    dVar14 = (pQVar5->Bounder).TL.Pos[0];
    if ((dVar12 < dVar14) && (dVar14 = (dVar12 - dVar14) / dVar9, dVar14 < dVar8)) {
      pQVar6 = pQVar5;
      dVar8 = dVar14;
    }
    dVar15 = dVar10 + dVar13;
    dVar14 = (pQVar5->Bounder).BR.Pos[1];
    if ((dVar14 < dVar15) && (dVar14 = (dVar15 - dVar14) / dVar10, dVar14 < dVar8)) {
      pQVar6 = pQVar5;
      dVar8 = dVar14;
    }
    dVar14 = (pQVar5->Bounder).TL.Pos[1];
    pQVar4 = pQVar7;
    if ((dVar15 < dVar14) && (dVar14 = (dVar15 - dVar14) / dVar10, dVar14 < dVar8)) {
      pQVar6 = pQVar5;
      dVar8 = dVar14;
    }
    for (; pQVar4 != (QuadTreeNode *)0x0; pQVar4 = (QuadTreeNode *)(pQVar4->Bounder).TL.Pos[0]) {
      pdVar1 = (double *)(pQVar4->Bounder).BR.Pos[0];
      dVar14 = pdVar1[6] * dVar11 + dVar13 * pdVar1[7] + pdVar1[8];
      if ((-0.05000000074505806 <= dVar14) &&
         (dVar16 = pdVar1[8] + pdVar1[6] * dVar12 + pdVar1[7] * dVar15, dVar16 < 0.0)) {
        dVar14 = dVar14 / (dVar14 - dVar16);
        dVar16 = dVar14 * dVar9 + dVar11;
        if ((*pdVar1 <= dVar16) &&
           (((dVar16 <= pdVar1[2] && (dVar16 = dVar14 * dVar10 + dVar13, pdVar1[1] <= dVar16)) &&
            (dVar16 <= pdVar1[3])))) {
          pQVar6 = pQVar4;
          dVar8 = dVar14;
        }
      }
    }
    *pos = dVar9 * dVar8 + dVar11;
    pos[1] = dVar10 * dVar8 + dVar13;
    if (bVar3) {
      AdvanceAnimation(PAnim,0.0,0);
    }
    if (pQVar6 == (QuadTreeNode *)0x0) {
      if (bVar3) {
        if ((KeyFlags & 1U) != 0) {
          *vec = *vec + -0.05000000074505806;
          KeyFlags = KeyFlags | 0x20;
        }
        if ((KeyFlags & 2U) != 0) {
          *vec = *vec + 0.05000000074505806;
          KeyFlags = KeyFlags & 0xffffffdf;
        }
        if ((0.0 < pos[2]) &&
           (dVar11 = pos[2] + dVar8 * TimeToGo * -0.029999999329447746, pos[2] = dVar11,
           dVar11 < 0.0)) {
          pos[2] = 0.0;
        }
        if ((pos[2] < 0.0) &&
           (dVar11 = TimeToGo * dVar8 * 0.029999999329447746 + pos[2], pos[2] = dVar11, 0.0 < dVar11
           )) {
          pos[2] = 0.0;
        }
      }
    }
    else if (pQVar6 == pQVar5) {
      pQVar5 = GetCollisionNode(lvl,pos,vec);
      pQVar7 = (QuadTreeNode *)&pQVar5->Contents;
      do {
        pQVar7 = (QuadTreeNode *)(pQVar7->Bounder).TL.Pos[0];
        if (pQVar7 == (QuadTreeNode *)0x0) break;
      } while (*(int *)((pQVar7->Bounder).TL.Pos + 1) != 2);
    }
    else {
      if ((KeyFlags & 0x10U) != 0) {
        KeyFlags = KeyFlags & 0xffffffe3;
      }
      dVar9 = (pQVar6->Bounder).BR.Pos[0];
      dVar11 = *vec * *(double *)((long)dVar9 + 0x30) + *(double *)((long)dVar9 + 0x38) * vec[1];
      dVar12 = *vec - dVar11 * *(double *)((long)dVar9 + 0x30);
      dVar14 = vec[1] - dVar11 * *(double *)((long)dVar9 + 0x38);
      *vec = dVar12;
      vec[1] = dVar14;
      dVar11 = *(double *)((long)dVar9 + 0x30);
      dVar13 = *(double *)((long)dVar9 + 0x38);
      dVar10 = atan2(dVar11,-dVar13);
      if ((((0.5 < ABS(dVar12 * dVar13 - dVar14 * dVar11)) ||
           ((dVar10 < 0.7853981633974483 && (0.0 <= dVar10)))) ||
          ((-0.7853981633974483 < dVar10 && (dVar10 <= 0.0)))) ||
         (ABS(dVar10 - pos[2]) < 0.7853981633974483)) {
        pos[2] = dVar10;
      }
      dVar11 = *vec * *(double *)((long)dVar9 + 0x38) - *(double *)((long)dVar9 + 0x30) * vec[1];
      if ((KeyFlags & 0x20U) == 0) {
        dVar11 = -dVar11;
      }
      AdvanceAnimation(PAnim,dVar11,1);
      dVar11 = *(double *)((long)dVar9 + 0x38);
      dVar13 = *(double *)((long)dVar9 + 0x30);
      lVar2 = *(long *)((long)dVar9 + 0x20);
      dVar10 = *(double *)(lVar2 + 0x10);
      dVar12 = (*vec * dVar11 - dVar13 * vec[1]) / dVar10;
      if ((KeyFlags & 1U) != 0) {
        dVar12 = dVar12 + Pusher;
        KeyFlags = KeyFlags | 0x20;
      }
      if ((KeyFlags & 2U) != 0) {
        dVar12 = dVar12 - Pusher;
        KeyFlags = KeyFlags & 0xffffffdf;
      }
      dVar14 = dVar10 * 0.05000000074505806;
      if (dVar12 <= 0.0) {
        dVar15 = 0.0;
        if (dVar12 <= -dVar14) {
          dVar15 = dVar14 + dVar12;
        }
      }
      else {
        dVar15 = 0.0;
        if (dVar14 <= dVar12) {
          dVar15 = dVar12 - dVar14;
        }
      }
      dVar12 = *vec * dVar13 + vec[1] * dVar11;
      if ((KeyFlags & 0xcU) == 4) {
        dVar12 = dVar12 + 5.0;
        KeyFlags = KeyFlags | 0x18;
      }
      *vec = dVar13 * dVar12 + dVar11 * dVar10 * dVar15;
      vec[1] = dVar12 * *(double *)((long)dVar9 + 0x38) -
               dVar15 * *(double *)(lVar2 + 0x10) * *(double *)((long)dVar9 + 0x30);
    }
    TimeToGo = TimeToGo - dVar8 * TimeToGo;
    if (TimeToGo <= 0.009999999776482582) {
      return pQVar5;
    }
  } while( true );
}

Assistant:

struct QuadTreeNode *RunPhysics(struct Level *lvl, double *pos,
                                double *vec, double TimeToGo,
                                struct Animation *PAnim)
{
   double MoveVec[2];
   struct QuadTreeNode *CollTree = GetCollisionNode(lvl, pos, vec);
   double CollTime, NCollTime;
   double End[2], ColPoint[2];
   void *CollPtr;
   double d1, d2;
   struct Edge *E;
   double r;
   int Contact;
   struct Container *EPtr, *FirstEdge;

   /* Step 1: apply gravity */
   vec[1] += 0.1f;

   /* Step 2: apply atmoshperic resistance */
   vec[0] *= 0.997f;
   vec[1] *= 0.997f;

   EPtr = CollTree->Contents;
   while (EPtr && EPtr->Type != EDGE)
      EPtr = EPtr->Next;
   FirstEdge = EPtr;

   /* Step 2: do collisions and reactions */
   do {
      Contact = false;

      /* rounding error fixup */
      EPtr = FirstEdge;
      while (EPtr) {
         /* simple line test */
         d1 =
            EPtr->Content.E->a * pos[0] +
            EPtr->Content.E->b * pos[1] + EPtr->Content.E->c;

         if (d1 >= (-0.5f) && d1 <= 0.05f &&
             pos[0] >= EPtr->Content.E->Bounder.TL.Pos[0]
             && pos[0] <= EPtr->Content.E->Bounder.BR.Pos[0]
             && pos[1] >= EPtr->Content.E->Bounder.TL.Pos[1]
             && pos[1] <= EPtr->Content.E->Bounder.BR.Pos[1]
            ) {
            pos[0] += EPtr->Content.E->a * (0.05f - d1);
            pos[1] += EPtr->Content.E->b * (0.05f - d1);
            Contact = true;
         }

         EPtr = EPtr->Next;
      }

      MoveVec[0] = TimeToGo * vec[0];
      MoveVec[1] = TimeToGo * vec[1];

      CollTime = 1.0f;
      End[0] = pos[0] + MoveVec[0];
      End[1] = pos[1] + MoveVec[1];
      CollPtr = NULL;

      /* search for collisions here */

      /* test 1: do we hit the edge of this collision tree node? */
      if (End[0] > CollTree->Bounder.BR.Pos[0]) {
         NCollTime = (End[0] - CollTree->Bounder.BR.Pos[0]) / MoveVec[0];
         if (NCollTime < CollTime) {
            CollTime = NCollTime;
            CollPtr = (void *)CollTree;
         }
      }

      if (End[0] < CollTree->Bounder.TL.Pos[0]) {
         NCollTime = (End[0] - CollTree->Bounder.TL.Pos[0]) / MoveVec[0];
         if (NCollTime < CollTime) {
            CollTime = NCollTime;
            CollPtr = (void *)CollTree;
         }
      }

      if (End[1] > CollTree->Bounder.BR.Pos[1]) {
         NCollTime = (End[1] - CollTree->Bounder.BR.Pos[1]) / MoveVec[1];
         if (NCollTime < CollTime) {
            CollTime = NCollTime;
            CollPtr = (void *)CollTree;
         }
      }

      if (End[1] < CollTree->Bounder.TL.Pos[1]) {
         NCollTime = (End[1] - CollTree->Bounder.TL.Pos[1]) / MoveVec[1];
         if (NCollTime < CollTime) {
            CollTime = NCollTime;
            CollPtr = (void *)CollTree;
         }
      }

      /* test 3: do we hit any of the edges contained in the tree? */
      EPtr = FirstEdge;
      while (EPtr) {
         /* simple line test */
         d1 =
            EPtr->Content.E->a * pos[0] +
            EPtr->Content.E->b * pos[1] + EPtr->Content.E->c;
         d2 =
            EPtr->Content.E->a * End[0] +
            EPtr->Content.E->b * End[1] + EPtr->Content.E->c;
         if ((d1 >= (-0.05f)) && (d2 < 0)) {
            NCollTime = d1 / (d1 - d2);

            ColPoint[0] = pos[0] + NCollTime * MoveVec[0];
            ColPoint[1] = pos[1] + NCollTime * MoveVec[1];
            if (ColPoint[0] >= EPtr->Content.E->Bounder.TL.Pos[0]
                && ColPoint[0] <= EPtr->Content.E->Bounder.BR.Pos[0]
                && ColPoint[1] >= EPtr->Content.E->Bounder.TL.Pos[1]
                && ColPoint[1] <= EPtr->Content.E->Bounder.BR.Pos[1]
               ) {
               CollTime = NCollTime;
               CollPtr = (void *)EPtr;
            }
         }

         /* move to next edge */
         EPtr = EPtr->Next;
      }

      /* advance - apply motion and resulting friction here! */
      pos[0] += MoveVec[0] * CollTime;
      pos[1] += MoveVec[1] * CollTime;
      if (!Contact)
         AdvanceAnimation(PAnim, 0, false);

      /* fix up */
      if (CollPtr) {
         if (CollPtr == (void *)CollTree) {
            CollTree = GetCollisionNode(lvl, pos, vec);
            EPtr = CollTree->Contents;
            while (EPtr && EPtr->Type != EDGE)
               EPtr = EPtr->Next;
            FirstEdge = EPtr;
         } else {
            /* edge collision */
            E = ((struct Container *)CollPtr)->Content.E;
            r = FixUp(vec, E->a, E->b);

            SetAngle(E->a, E->b, &pos[2],
                     (fabs(vec[0] * E->b - vec[1] * E->a) > 0.5f));
            AdvanceAnimation(PAnim,
                             (vec[0] * E->b -
                              vec[1] * E->a) *
                             ((KeyFlags & KEYFLAG_FLIP) ? 1.0f : -1.0f),
                             true);

            /* apply friction */
            DoFriction(r, E, vec);
         }
      } else if (!Contact) {
         /* check if currently in contact with any surface. If not then do empty space movement */
         if (KeyFlags & KEYFLAG_LEFT) {
            vec[0] -= 0.05f;
            KeyFlags |= KEYFLAG_FLIP;
         }
         if (KeyFlags & KEYFLAG_RIGHT) {
            vec[0] += 0.05f;
            KeyFlags &= ~KEYFLAG_FLIP;
         }
         if (pos[2] > 0) {
            pos[2] -= TimeToGo * CollTime * 0.03f;
            if (pos[2] < 0)
               pos[2] = 0;
         }
         if (pos[2] < 0) {
            pos[2] += TimeToGo * CollTime * 0.03f;
            if (pos[2] > 0)
               pos[2] = 0;
         }
      }

      /* reduce time & continue */
      TimeToGo -= TimeToGo * CollTime;
   }
   while (TimeToGo > 0.01f);

   return CollTree;
}